

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O2

string * gmlc::utilities::randomString_abi_cxx11_(size_type length)

{
  long lVar1;
  int iVar2;
  result_type rVar3;
  size_type in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long *in_FS_OFFSET;
  bool bVar4;
  size_type local_13b0;
  random_device local_13a8;
  
  lVar1 = *in_FS_OFFSET;
  local_13b0 = in_RSI;
  if (*(char *)(lVar1 + -0x20) == '\0') {
    std::random_device::random_device(&local_13a8);
    iVar2 = std::random_device::_M_getval();
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)(lVar1 + -0x13a8),(ulong)(uint)(iVar2 + (int)&local_13b0));
    std::random_device::~random_device(&local_13a8);
    *(undefined1 *)(lVar1 + -0x20) = 1;
  }
  if (*(char *)(lVar1 + -8) == '\0') {
    *(undefined8 *)(lVar1 + -0x18) = 0;
    *(undefined8 *)(lVar1 + -0x10) = 0x3d;
    *(undefined1 *)(lVar1 + -8) = 1;
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (in_RDI,local_13b0);
  while( true ) {
    bVar4 = local_13b0 == 0;
    local_13b0 = local_13b0 - 1;
    if (bVar4) break;
    rVar3 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)(lVar1 + -0x18),
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)(lVar1 + -0x13a8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[rVar3]);
  }
  return (string *)in_RDI;
}

Assistant:

std::string randomString(std::string::size_type length)
{
    static constexpr auto chars =
        "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

    thread_local static std::mt19937 rng{
        std::random_device{}() +
        static_cast<uint32_t>(
            reinterpret_cast<uint64_t>(&length) &  // NOLINT
            0xFFFFFFFFU)};
    thread_local static std::uniform_int_distribution<std::string::size_type>
        pick(0, 61);
    std::string randomString;

    randomString.reserve(length);

    while (length-- != 0U) {
        randomString.push_back(chars[pick(rng)]);
    }

    return randomString;
}